

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O2

void ftgtbh_(int *A1,int *A2,int *A3,int *A4,char *A5,int *A6,char *A7,char *A8,char *A9,int *A10,
            size_t C5,size_t C7,size_t C8,size_t C9)

{
  uint maxfield;
  char **__ptr;
  char **__ptr_00;
  char **ppcVar1;
  char *pcVar2;
  char *s;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  unsigned_long uVar6;
  int nelem;
  ulong uVar7;
  int nelem_00;
  uint celem_len;
  int felem_len;
  int iVar8;
  long tfields;
  long B6;
  long B3;
  long B2;
  char **local_88;
  ulong local_80;
  char **local_78;
  ulong local_70;
  ulong local_68;
  char *local_60;
  int *local_58;
  fitsfile *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_50 = gFitsFiles[*A1];
  local_60 = A5;
  local_58 = A6;
  local_48 = A3;
  local_40 = A2;
  local_38 = A4;
  ffgkyj(local_50,"TFIELDS",&tfields,(char *)0x0,A10);
  maxfield = (uint)tfields;
  B2 = (long)*A2;
  uVar7 = 1;
  if (1 < (int)(uint)tfields) {
    uVar7 = (ulong)(uint)tfields;
  }
  B3 = (long)*A3;
  uVar6 = C5;
  if (C5 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  celem_len = (int)uVar6 + 1;
  local_68 = uVar7;
  ppcVar1 = (char **)malloc(uVar7 * 8);
  iVar5 = (int)uVar7;
  local_78 = ppcVar1;
  local_70 = (ulong)celem_len;
  pcVar2 = (char *)malloc((ulong)(celem_len * iVar5));
  *ppcVar1 = pcVar2;
  pcVar2 = f2cstrv2(A5,pcVar2,(int)C5,celem_len,iVar5);
  vindex(ppcVar1,celem_len,iVar5,pcVar2);
  B6 = (long)*A6;
  uVar7 = (ulong)(uint)tfields;
  if ((int)(uint)tfields < 2) {
    uVar7 = 1;
  }
  uVar6 = C7;
  if (C7 < gMinStrLen) {
    uVar6 = gMinStrLen;
  }
  iVar5 = (int)uVar6 + 1;
  ppcVar1 = (char **)malloc(uVar7 * 8);
  nelem = (int)uVar7;
  local_88 = ppcVar1;
  pcVar2 = (char *)malloc((ulong)(uint)(iVar5 * nelem));
  *ppcVar1 = pcVar2;
  pcVar2 = f2cstrv2(A7,pcVar2,(int)C7,iVar5,nelem);
  vindex(ppcVar1,iVar5,nelem,pcVar2);
  uVar7 = 1;
  if (1 < (int)(uint)tfields) {
    uVar7 = (ulong)(uint)tfields;
  }
  felem_len = (int)C8;
  iVar8 = felem_len;
  if (C8 < gMinStrLen) {
    iVar8 = (int)gMinStrLen;
  }
  iVar8 = iVar8 + 1;
  local_80 = uVar7;
  ppcVar1 = (char **)malloc(uVar7 * 8);
  nelem_00 = (int)uVar7;
  pcVar2 = (char *)malloc((ulong)(uint)(iVar8 * nelem_00));
  *ppcVar1 = pcVar2;
  pcVar2 = f2cstrv2(A8,pcVar2,felem_len,iVar8,nelem_00);
  vindex(ppcVar1,iVar8,nelem_00,pcVar2);
  sVar4 = gMinStrLen;
  if (gMinStrLen <= C9) {
    sVar4 = C9;
  }
  s = (char *)malloc(sVar4 + 1);
  s[C9] = '\0';
  pcVar2 = A9;
  memcpy(s,A9,C9);
  kill_trailing(s,(char)pcVar2);
  __ptr_00 = local_78;
  __ptr = local_88;
  ffghtb(local_50,maxfield,&B2,&B3,local_38,local_78,&B6,local_88,ppcVar1,s,A10);
  *local_40 = (int)B2;
  *local_48 = (int)B3;
  c2fstrv2(*__ptr_00,local_60,(int)local_70,(int)C5,(int)local_68);
  free(*__ptr_00);
  free(__ptr_00);
  *local_58 = (int)B6;
  c2fstrv2(*__ptr,A7,iVar5,(int)C7,nelem);
  free(*__ptr);
  free(__ptr);
  c2fstrv2(*ppcVar1,A8,iVar8,felem_len,(int)local_80);
  free(*ppcVar1);
  free(ppcVar1);
  sVar3 = strlen(s);
  sVar4 = C9;
  if (sVar3 < C9) {
    sVar4 = sVar3;
  }
  memcpy(A9,s,sVar4);
  if (sVar3 <= C9 && C9 - sVar3 != 0) {
    memset(A9 + sVar3,0x20,C9 - sVar3);
  }
  free(s);
  return;
}

Assistant:

CFextern VOID_cfF(FTGTBH,ftgtbh)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),FITSUNIT,PLONG,PLONG,PINT,PSTRINGV,PLONG,PSTRINGV,PSTRINGV,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0))
{
   QCF(FITSUNIT,1)
   QCF(PLONG,2)
   QCF(PLONG,3)
   QCF(PINT,4)
   QCF(PSTRINGV,5)
   QCF(PLONG,6)
   QCF(PSTRINGV,7)
   QCF(PSTRINGV,8)
   QCF(PSTRING,9)
   QCF(PINT,10)

   fitsfile *fptr;
   long tfields;
   int *status;

   fptr = TCF(ftgtbh,FITSUNIT,1,0);
   status =  TCF(ftgtbh,PINT,10,0);
   ffgkyj( fptr, "TFIELDS", &tfields, 0, status );

   ffghtb(   fptr, (int)tfields
             TCF(ftgtbh,PLONG,2,1)
             TCF(ftgtbh,PLONG,3,1)
             TCF(ftgtbh,PINT,4,1)
             TCF(ftgtbh,PSTRINGV,5,1)
             TCF(ftgtbh,PLONG,6,1)
             TCF(ftgtbh,PSTRINGV,7,1)
             TCF(ftgtbh,PSTRINGV,8,1)
             TCF(ftgtbh,PSTRING,9,1)
             , status );

   RCF(FITSUNIT,1)
   RCF(PLONG,2)
   RCF(PLONG,3)
   RCF(PINT,4)
   RCF(PSTRINGV,5)
   RCF(PLONG,6)
   RCF(PSTRINGV,7)
   RCF(PSTRINGV,8)
   RCF(PSTRING,9)
   RCF(PINT,10)
}